

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.h
# Opt level: O1

void __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::Dispose(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
          *this,bool isShutdown)

{
  DetachedStateBase *pDVar1;
  
  pDVar1 = (this->mappedSerializedScriptValue).ptr;
  if (pDVar1 != (DetachedStateBase *)0x0) {
    if (pDVar1->hasBeenClaimed == false) {
      (*pDVar1->_vptr_DetachedStateBase[3])(pDVar1);
    }
    (*pDVar1->_vptr_DetachedStateBase[2])(pDVar1);
    return;
  }
  return;
}

Assistant:

virtual void Dispose(bool isShutdown) override
        {
#ifndef NTBUILD
            if (this->mappedSerializedScriptValue != nullptr)
            {
                // We have to extend the buffer data's lifetime until Dispose because
                // it might be used during finalization of other objects, such as
                // FunctionEntryPointInfo which wants to log its name.
                this->mappedSerializedScriptValue->CleanUp();
            }
#endif
        }